

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O2

rect_t<char> *
read_rect(rect_t<char> *__return_storage_ptr__,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *lines)

{
  pointer pbVar1;
  pointer __r;
  pointer pvVar2;
  copy_result<borrowed_iterator_t<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char>_>_>
  cVar3;
  allocator_type local_51;
  rect_t<char> *local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(lines->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(lines->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_48);
  pvVar2 = (__return_storage_ptr__->
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = __return_storage_ptr__;
  for (__r = (lines->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __r != pbVar1; __r = __r + 1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__r->_M_string_length,&local_51);
    cVar3 = std::ranges::__copy_fn::
            operator()<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                      ((__copy_fn *)&std::ranges::copy,__r,local_48);
    std::vector<char,_std::allocator<char>_>::_M_move_assign
              (pvVar2,(allocator_type *)&local_48,cVar3.out._M_current._M_current);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&local_48);
    pvVar2 = pvVar2 + 1;
  }
  return local_50;
}

Assistant:

rect_t<char> read_rect(const std::vector<std::string>& lines) {
  auto rect = rect_t<char> (lines.size());

  ranges::transform(lines, rect.begin(), [](const std::string& l){
    auto line = line_t<char> (l.size());
    ranges::copy(l, line.begin());
    return line;
  });

  return rect;
}